

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PL_approximation.h
# Opt level: O1

VectorXd __thiscall
Gudhi::coxeter_triangulation::
PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
::operator()(PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
             *this,VectorXd *p)

{
  ulong rows;
  double *pdVar1;
  undefined1 auVar2 [16];
  PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  *pPVar3;
  long lVar4;
  const_iterator cVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar6;
  undefined8 *puVar7;
  ulong uVar8;
  char *__function;
  Matrix<double,__1,_1,_0,__1,_1> *in_RDX;
  double *pdVar9;
  double *pdVar10;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar11;
  long lVar12;
  bool bVar13;
  VectorXd VVar14;
  VectorXd z;
  MatrixXd vertex_matrix;
  MatrixXd matrix;
  VectorXd pt_v;
  VectorXd lambda;
  vector<int,_std::allocator<int>_> v;
  VectorXd fun_v;
  Simplex_handle s;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_208;
  DenseStorage<double,__1,__1,__1,_0> local_1d8;
  DenseStorage<double,__1,__1,__1,_0> local_1b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1a0;
  undefined1 local_198 [48];
  double *local_168;
  byte local_160;
  vector<int,_std::allocator<int>_> local_150;
  PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,_Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
  *local_138;
  double *local_130;
  Matrix<double,__1,_1,_0,__1,_1> *local_128;
  VectorXd *local_120;
  Vertex_handle *local_118;
  undefined1 local_110 [32];
  double *local_f0;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_e8;
  undefined1 local_d0 [48];
  const_iterator local_a0;
  const_iterator cStack_98;
  vector<int,_std::allocator<int>_> local_90;
  bool local_78;
  undefined7 uStack_77;
  void *local_68;
  
  rows = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  pdVar1 = p[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_118 = (Vertex_handle *)(p + 3);
  local_128 = in_RDX;
  local_120 = p;
  Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
  ::locate_point<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Simplex_handle *)(local_110 + 0x10),local_118,in_RDX,1.0);
  uVar8 = ((long)local_e8.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_e8.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_1b8.m_data = (double *)0x0;
  local_1b8.m_rows = 0;
  local_1b8.m_cols = 0;
  if (-1 < (long)(uVar8 | rows)) {
    if ((local_e8.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish !=
         local_e8.
         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start && rows != 0) &&
       (auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar2 / SEXT816((long)uVar8),0) < (long)rows)) {
      puVar7 = (undefined8 *)
               __cxa_allocate_exception
                         (8,CONCAT71((int7)((uVar8 | rows) >> 8),rows == 0),
                          SUB168(auVar2 % SEXT816((long)uVar8),0));
      *puVar7 = operator_delete;
      __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1b8,uVar8 * rows,rows,uVar8);
    pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)pdVar1 + 1);
    uVar8 = ((long)local_e8.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_e8.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    local_1d8.m_data = (double *)0x0;
    local_1d8.m_rows = 0;
    local_1d8.m_cols = 0;
    if (-1 < (long)(uVar8 | (ulong)pvVar6)) {
      if ((local_e8.
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           local_e8.
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start &&
           pvVar6 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) &&
         (auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
         SUB168(auVar2 / SEXT816((long)uVar8),0) < (long)pvVar6)) {
        puVar7 = (undefined8 *)
                 __cxa_allocate_exception
                           (8,CONCAT71((int7)((uVar8 | (ulong)pvVar6) >> 8),
                                       pvVar6 == (vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  *)0x0),SUB168(auVar2 % SEXT816((long)uVar8),0));
        *puVar7 = operator_delete;
        __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      local_1a0 = pvVar6;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                (&local_1d8,uVar8 * (long)pvVar6,(Index)pvVar6,uVar8);
      if ((long)local_e8.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_e8.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        if (local_1d8.m_rows < 1) {
LAB_00128140:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                       );
        }
        lVar4 = ((long)local_e8.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_e8.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        lVar12 = 0;
        pdVar9 = local_1d8.m_data;
        do {
          if (local_1d8.m_cols <= lVar12) goto LAB_00128140;
          *pdVar9 = 1.0;
          lVar12 = lVar12 + 1;
          pdVar9 = pdVar9 + local_1d8.m_rows;
        } while (lVar4 + (ulong)(lVar4 == 0) != lVar12);
      }
      Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::vertex_range((Vertex_range *)local_d0,
                     (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      *)(local_110 + 0x10));
      local_208.o_it_._M_current =
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0._0_8_;
      local_208.o_end_._M_current =
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0._8_8_;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_208.value_,(vector<int,_std::allocator<int>_> *)(local_d0 + 0x10));
      local_208.is_end_ = local_d0[0x28];
      local_198._16_8_ = local_a0._M_current;
      local_198._24_8_ = cStack_98._M_current;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)(local_198 + 0x20),&local_90);
      local_160 = local_78;
      local_138 = this;
      local_130 = pdVar1;
      if ((local_208.is_end_ & local_78) == 0) {
        lVar4 = 0;
        lVar12 = 0;
        do {
          std::vector<int,_std::allocator<int>_>::vector(&local_150,&local_208.value_);
          Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::cartesian_coordinates
                    ((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      *)local_198,local_118,1.0);
          Function_Sm_in_Rd::operator()((Function_Sm_in_Rd *)local_110,local_120);
          if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1 < local_1a0) {
            pdVar9 = (double *)0x1;
            do {
              if ((long)local_198._8_8_ < (long)pdVar9) goto LAB_0012815f;
              if (((lVar12 < 0) || (local_1d8.m_rows <= (long)pdVar9)) ||
                 (local_1d8.m_cols <= lVar12)) goto LAB_00128140;
              *(undefined8 *)((long)local_1d8.m_data + (long)pdVar9 * 8 + local_1d8.m_rows * lVar4)
                   = *(undefined8 *)(local_198._0_8_ + (long)pdVar9 * 8 + -8);
              bVar13 = pdVar9 != pdVar1;
              pdVar9 = (double *)((long)pdVar9 + 1);
            } while (bVar13);
          }
          if (rows != 0) {
            uVar8 = 0;
            do {
              if ((long)local_110._8_8_ <= (long)uVar8) goto LAB_0012815f;
              if (((lVar12 < 0) || (local_1b8.m_rows <= (long)uVar8)) ||
                 (local_1b8.m_cols <= lVar12)) goto LAB_00128140;
              *(double *)((long)local_1b8.m_data + uVar8 * 8 + local_1b8.m_rows * lVar4) =
                   *(double *)(local_110._0_8_ + uVar8 * 8);
              uVar8 = uVar8 + 1;
            } while (rows != uVar8);
          }
          free((void *)local_110._0_8_);
          free((void *)local_198._0_8_);
          if ((ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x0) {
            operator_delete(local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_208.is_end_ == false) {
            Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            ::update_value(&local_208);
            local_208.o_it_._M_current = local_208.o_it_._M_current + 1;
            if (local_208.o_it_._M_current == local_208.o_end_._M_current) {
              local_208.is_end_ = true;
            }
          }
          lVar12 = lVar12 + 1;
          lVar4 = lVar4 + 8;
        } while ((local_208.is_end_ != true) || ((local_160 & 1) == 0));
      }
      else {
        lVar12 = 0;
      }
      if ((double *)local_198._32_8_ != (double *)0x0) {
        operator_delete((void *)local_198._32_8_,(long)local_168 - local_198._32_8_);
      }
      pdVar1 = local_130;
      if (local_208.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_208.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_208.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_208.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((pointer)local_d0._16_8_ != (pointer)0x0) {
        operator_delete((void *)local_d0._16_8_,local_d0._32_8_ - local_d0._16_8_);
      }
      pvVar6 = local_1a0;
      if (lVar12 != ((long)local_e8.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_e8.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
        __assert_fail("j == s.dimension() + 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/include/gudhi/Functions/PL_approximation.h"
                      ,0x35,
                      "Eigen::VectorXd Gudhi::coxeter_triangulation::PL_approximation<Gudhi::coxeter_triangulation::Function_Sm_in_Rd, Gudhi::coxeter_triangulation::Coxeter_triangulation<>>::operator()(const Eigen::VectorXd &) const [Function_ = Gudhi::coxeter_triangulation::Function_Sm_in_Rd, Triangulation_ = Gudhi::coxeter_triangulation::Coxeter_triangulation<>]"
                     );
      }
      local_208.o_it_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      local_208.o_end_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      if ((long)local_1a0 < 0) {
        __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      cVar5._M_current = local_208.o_it_._M_current;
      if (local_1a0 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
        free((void *)0x0);
        if (pvVar6 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
          local_208.o_it_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
          cVar5._M_current = local_208.o_it_._M_current;
        }
        else {
          if ((ulong)pvVar6 >> 0x3d != 0) {
LAB_00128230:
            puVar7 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar7 = operator_delete;
            __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          cVar5._M_current =
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)malloc((long)pvVar6 * 8);
          if ((pdVar1 != (double *)0x0) && (((ulong)cVar5._M_current & 0xf) != 0))
          goto LAB_0012825e;
          if (cVar5._M_current == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0)
          goto LAB_00128230;
        }
      }
      local_208.o_it_._M_current = cVar5._M_current;
      local_208.o_end_._M_current = pvVar6;
      if (pvVar6 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
LAB_0012815f:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      ((local_208.o_it_._M_current)->
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
      if (pdVar1 != (double *)0x0) {
        pdVar9 = (local_128->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        pdVar10 = (double *)0x0;
        do {
          if ((local_128->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows <= (long)pdVar10) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                         );
          }
          (&((local_208.o_it_._M_current)->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish)[(long)pdVar10] = (pointer)pdVar9[(long)pdVar10];
          pdVar10 = (double *)((long)pdVar10 + 1);
        } while (pdVar1 != pdVar10);
      }
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_d0,
                 (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_1d8);
      Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
      _check_solve_assertion<false,Eigen::MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
                 local_d0,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_208);
      local_198._16_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      local_198._24_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_d0;
      if (-1 < (long)local_d0._16_8_) {
        pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198._16_8_;
        local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)&local_208;
        if ((pointer)local_d0._16_8_ != (pointer)0x0) {
          local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)&local_208;
          free((void *)0x0);
          if ((pointer)local_d0._16_8_ != (pointer)0x0) {
            if ((ulong)local_d0._16_8_ >> 0x3d == 0) {
              pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       malloc(local_d0._16_8_ * 8);
              if ((pointer)local_d0._16_8_ != (pointer)0x1 && ((ulong)pvVar6 & 0xf) != 0) {
LAB_0012825e:
                __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                              ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                              "void *Eigen::internal::aligned_malloc(std::size_t)");
              }
              if (pvVar6 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0)
              goto LAB_00128025;
            }
            puVar7 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar7 = operator_delete;
            __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          local_198._16_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
          pvVar6 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198._16_8_;
        }
LAB_00128025:
        local_198._16_8_ = pvVar6;
        local_198._24_8_ = local_d0._16_8_;
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run((Matrix<double,__1,_1,_0,__1,_1> *)(local_198 + 0x10),(SrcXprType *)&local_150,
              (assign_op<double,_double> *)local_198);
        free(local_68);
        free((void *)CONCAT71(uStack_77,local_78));
        free(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
        free(cStack_98._M_current);
        free((void *)CONCAT71(local_d0._41_7_,local_d0[0x28]));
        free((void *)local_d0._24_8_);
        free((void *)local_d0._0_8_);
        pPVar3 = local_138;
        if (local_1b8.m_cols != local_198._24_8_) {
          __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                        ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                        "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                       );
        }
        local_d0._0_8_ = &local_1b8;
        local_d0._8_8_ = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_198 + 0x10)
        ;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_138,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                    *)local_d0);
        free((void *)local_198._16_8_);
        free(local_208.o_it_._M_current);
        free(local_1d8.m_data);
        free(local_1b8.m_data);
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::~vector(&local_e8);
        IVar11 = extraout_RDX;
        if ((double *)local_110._16_8_ != (double *)0x0) {
          operator_delete((void *)local_110._16_8_,(long)local_f0 - local_110._16_8_);
          IVar11 = extraout_RDX_00;
        }
        VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             IVar11;
        VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)pPVar3;
        return (VectorXd)
               VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
      }
      __function = 
      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
      ;
      local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)&local_208;
      goto LAB_00128207;
    }
  }
  __function = 
  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
  ;
LAB_00128207:
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,__function);
}

Assistant:

Eigen::VectorXd operator()(const Eigen::VectorXd& p) const {
    std::size_t cod_d = this->cod_d();
    std::size_t amb_d = this->amb_d();
    auto s = tr_.locate_point(p);
    Eigen::MatrixXd matrix(cod_d, s.dimension() + 1);
    Eigen::MatrixXd vertex_matrix(amb_d + 1, s.dimension() + 1);
    for (std::size_t i = 0; i < s.dimension() + 1; ++i) vertex_matrix(0, i) = 1;
    std::size_t j = 0;
    for (auto v : s.vertex_range()) {
      Eigen::VectorXd pt_v = tr_.cartesian_coordinates(v);
      Eigen::VectorXd fun_v = fun_(pt_v);
      for (std::size_t i = 1; i < amb_d + 1; ++i) vertex_matrix(i, j) = pt_v(i - 1);
      for (std::size_t i = 0; i < cod_d; ++i) matrix(i, j) = fun_v(i);
      j++;
    }
    assert(j == s.dimension() + 1);
    Eigen::VectorXd z(amb_d + 1);
    z(0) = 1;
    for (std::size_t i = 1; i < amb_d + 1; ++i) z(i) = p(i - 1);
    Eigen::VectorXd lambda = vertex_matrix.colPivHouseholderQr().solve(z);
    Eigen::VectorXd result = matrix * lambda;
    return result;
  }